

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O1

dev_t pack_bsdos(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  u_long uVar2;
  dev_t dVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  
  if (n == 3) {
    uVar2 = numbers[1];
    uVar5 = (uint)*numbers;
    uVar1 = numbers[2];
    dVar3 = uVar1 & 0xff | (ulong)(uVar5 << 0x14) | (ulong)(((uint)uVar2 & 0xfff) << 8);
    uVar6 = (ulong)((uint)uVar2 & 0xfff);
    if (((uVar1 < 0x100) && ((ulong)(uVar5 & 0xfff) == *numbers)) && (uVar6 == uVar2)) {
      return dVar3;
    }
    pcVar7 = "invalid major number";
    if (uVar6 != uVar2) {
      pcVar7 = "invalid unit number";
    }
    pcVar4 = "invalid subunit number";
    if (uVar1 < 0x100) {
      pcVar4 = pcVar7;
    }
  }
  else if (n == 2) {
    uVar1 = numbers[1];
    uVar5 = (uint)*numbers;
    dVar3 = (dev_t)((uint)uVar1 & 0xfffff | uVar5 << 0x14);
    if (uVar1 < 0x100000 && (ulong)(uVar5 & 0xfff) == *numbers) {
      return dVar3;
    }
    pcVar4 = "invalid major number";
    if (0xfffff < uVar1) {
      pcVar4 = "invalid minor number";
    }
  }
  else {
    dVar3 = 0;
    pcVar4 = "too many fields for format";
  }
  *error = pcVar4;
  return dVar3;
}

Assistant:

static dev_t
pack_bsdos(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_12_20(numbers[0], numbers[1]);
		if ((u_long)major_12_20(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_12_20(dev) != numbers[1])
			*error = iMinorError;
	} else if (n == 3) {
		dev = makedev_12_12_8(numbers[0], numbers[1], numbers[2]);
		if ((u_long)major_12_12_8(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)unit_12_12_8(dev) != numbers[1])
			*error = "invalid unit number";
		if ((u_long)subunit_12_12_8(dev) != numbers[2])
			*error = "invalid subunit number";
	} else
		*error = tooManyFields;
	return (dev);
}